

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

void __thiscall pstack::MmapReader::MmapReader(MmapReader *this,Context *c,string *name_)

{
  int __fd;
  Exception *this_00;
  Exception *pEVar1;
  int *piVar2;
  char *local_278;
  Exception local_270;
  char *local_d0;
  void *p;
  stat s;
  int fd;
  string *name__local;
  Context *c_local;
  MmapReader *this_local;
  
  MemReader::MemReader(&this->super_MemReader,name_,0,(char *)0x0);
  (this->super_MemReader).super_Reader._vptr_Reader = (_func_int **)&PTR__MmapReader_002f2808;
  __fd = Context::openfile(c,name_,0,0x1ff);
  s.__glibc_reserved[0] = 0;
  s.__glibc_reserved[1] = 0;
  s.st_ctim.tv_sec = 0;
  s.st_ctim.tv_nsec = 0;
  s.st_mtim.tv_sec = 0;
  s.st_mtim.tv_nsec = 0;
  s.st_atim.tv_sec = 0;
  s.st_atim.tv_nsec = 0;
  s.st_blksize = 0;
  s.st_blocks = 0;
  s.st_rdev = 0;
  s.st_size = 0;
  s.st_mode = 0;
  s.st_uid = 0;
  s.st_gid = 0;
  s.__pad0 = 0;
  s.st_ino = 0;
  s.st_nlink = 0;
  p = (void *)0x0;
  s.st_dev = 0;
  fstat64(__fd,(stat64 *)&p);
  (this->super_MemReader).len = s.st_rdev;
  local_d0 = (char *)mmap64((void *)0x0,(this->super_MemReader).len,1,2,__fd,0);
  close(__fd);
  if (local_d0 == (char *)0xffffffffffffffff) {
    this_00 = (Exception *)__cxa_allocate_exception();
    memset(&local_270,0,0x1a0);
    Exception::Exception(&local_270);
    pEVar1 = Exception::operator<<(&local_270,(char (*) [14])"mmap failed: ");
    piVar2 = __errno_location();
    local_278 = strerror(*piVar2);
    pEVar1 = Exception::operator<<(pEVar1,&local_278);
    Exception::Exception(this_00,pEVar1);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  (this->super_MemReader).data = local_d0;
  return;
}

Assistant:

MmapReader::MmapReader(Context &c, const string &name_)
   : MemReader(name_, 0, nullptr)
{
   int fd = c.openfile(name_);
   struct stat s{};
   fstat(fd, &s);
   len = s.st_size;
   void *p = mmap(nullptr, len, PROT_READ, MAP_PRIVATE, fd, 0);
   close(fd);
   if (p == MAP_FAILED)
      throw (Exception() << "mmap failed: " << strerror(errno));
   data = static_cast<char *>(p);
}